

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

int ON_COMPONENT_INDEX::Compare(ON_COMPONENT_INDEX *lhs,ON_COMPONENT_INDEX *rhs)

{
  int rhs_i;
  int lhs_i;
  ON_COMPONENT_INDEX *rhs_local;
  ON_COMPONENT_INDEX *lhs_local;
  
  if ((int)lhs->m_type < (int)rhs->m_type) {
    lhs_local._4_4_ = -1;
  }
  else if ((int)rhs->m_type < (int)lhs->m_type) {
    lhs_local._4_4_ = 1;
  }
  else if (lhs->m_index < rhs->m_index) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->m_index < lhs->m_index) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = 0;
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_COMPONENT_INDEX::Compare( const ON_COMPONENT_INDEX* lhs, const ON_COMPONENT_INDEX* rhs )
{
  const int lhs_i = (int)lhs->m_type;
  const int rhs_i = (int)rhs->m_type;
  if (lhs_i < rhs_i)
    return -1;
  if (lhs_i > rhs_i)
    return 1;

  if (lhs->m_index < rhs->m_index)
    return -1;
  if (lhs->m_index > rhs->m_index)
    return 1;
  return 0;
}